

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_manager.cpp
# Opt level: O3

void __thiscall foxxll::block_manager::block_manager(block_manager *this)

{
  CountingPtr<foxxll::file,_tlx::CountingPtrDefaultDeleter> *this_00;
  value_type *pvVar1;
  byte bVar2;
  instance_pointer this_01;
  disk_config *cfg;
  instance_pointer this_02;
  disk_block_allocator *this_03;
  size_type new_size;
  size_t disk;
  string local_1d0;
  long local_1b0;
  Logger local_1a8;
  
  (this->mutex_).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->mutex_).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  *(undefined8 *)((long)&(this->mutex_).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->mutex_).super___mutex_base._M_mutex + 0x10) = 0;
  this->maximum_allocation_ = 0;
  (this->mutex_).super___mutex_base._M_mutex.__align = 0;
  this->total_allocation_ = 0;
  this->current_allocation_ = 0;
  (this->block_allocators_).size_ = 0;
  (this->block_allocators_).array_ = (value_type *)0x0;
  (this->disk_files_).size_ = 0;
  (this->disk_files_).array_ = (value_type *)0x0;
  this_01 = singleton<foxxll::config,true>::instance_;
  if (singleton<foxxll::config,true>::instance_ == (config *)0x0) {
    this_01 = singleton<foxxll::config,_true>::create_instance<foxxll::config>();
  }
  bVar2 = this_01->is_initialized;
  if ((bool)bVar2 == false) {
    (*this_01->_vptr_config[3])(this_01);
    bVar2 = this_01->is_initialized;
  }
  if ((bVar2 & 1) == 0) {
    (*this_01->_vptr_config[3])(this_01);
  }
  new_size = ((long)(this_01->disks_list).
                    super__Vector_base<foxxll::disk_config,_std::allocator<foxxll::disk_config>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(this_01->disks_list).
                    super__Vector_base<foxxll::disk_config,_std::allocator<foxxll::disk_config>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 3) * 0x4ec4ec4ec4ec4ec5;
  this->ndisks_ = new_size;
  tlx::SimpleVector<foxxll::disk_block_allocator_*,_(tlx::SimpleVectorMode)0>::resize
            (&this->block_allocators_,new_size);
  tlx::
  SimpleVector<tlx::CountingPtr<foxxll::file,_tlx::CountingPtrDefaultDeleter>,_(tlx::SimpleVectorMode)0>
  ::resize(&this->disk_files_,this->ndisks_);
  if (this->ndisks_ != 0) {
    disk = 0;
    local_1b0 = 0;
    do {
      cfg = config::disk(this_01,disk);
      if (cfg->queue == -1) {
        cfg->queue = (int)disk;
      }
      create_file((foxxll *)&local_1a8,cfg,0xc,(int)disk);
      pvVar1 = (this->disk_files_).array_;
      if (pvVar1[disk].ptr_ != (file *)local_1a8._0_8_) {
        this_00 = pvVar1 + disk;
        tlx::CountingPtr<foxxll::file,_tlx::CountingPtrDefaultDeleter>::dec_reference(this_00);
        this_00->ptr_ = (file *)local_1a8._0_8_;
        local_1a8._0_8_ = (file *)0x0;
      }
      tlx::CountingPtr<foxxll::file,_tlx::CountingPtrDefaultDeleter>::dec_reference
                ((CountingPtr<foxxll::file,_tlx::CountingPtrDefaultDeleter> *)&local_1a8);
      tlx::Logger::Logger(&local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a8,"foxxll: Disk \'",0xe);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a8,(cfg->path)._M_dataplus._M_p,(cfg->path)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a8,"\' is allocated, space: ",0x17);
      std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a8," MiB, I/O implementation: ",0x1a);
      disk_config::fileio_string_abi_cxx11_(&local_1d0,cfg);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a8,local_1d0._M_dataplus._M_p,local_1d0._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
        operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
      }
      tlx::Logger::~Logger(&local_1a8);
      local_1b0 = local_1b0 + cfg->size;
      this_02 = singleton<foxxll::disk_queues,true>::instance_;
      if (singleton<foxxll::disk_queues,true>::instance_ == (disk_queues *)0x0) {
        this_02 = singleton<foxxll::disk_queues,_true>::create_instance<foxxll::disk_queues>();
      }
      disk_queues::make_queue(this_02,(this->disk_files_).array_[disk].ptr_);
      this_03 = (disk_block_allocator *)operator_new(0x80);
      disk_block_allocator::disk_block_allocator(this_03,(this->disk_files_).array_[disk].ptr_,cfg);
      (this->block_allocators_).array_[disk] = this_03;
      disk = disk + 1;
    } while (disk < this->ndisks_);
    if (1 < this->ndisks_) {
      tlx::Logger::Logger(&local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a8,"foxxll: In total ",0x11);
      std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a8," disks are allocated, space: ",0x1d);
      std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8," MiB",4);
      tlx::Logger::~Logger(&local_1a8);
    }
  }
  return;
}

Assistant:

block_manager::block_manager()
{
    config* config = config::get_instance();

    // initialize config (may read config files now)
    config->check_initialized();

    // allocate block_allocators_
    ndisks_ = config->disks_number();
    block_allocators_.resize(ndisks_);
    disk_files_.resize(ndisks_);

    uint64_t total_size = 0;

    for (size_t i = 0; i < ndisks_; ++i)
    {
        disk_config& cfg = config->disk(i);

        // assign queues in order of disks.
        if (cfg.queue == file::DEFAULT_QUEUE)
            cfg.queue = i;

        try
        {
            disk_files_[i] = create_file(cfg, file::CREAT | file::RDWR, i);

            TLX_LOG1 << "foxxll: Disk '" << cfg.path << "' is allocated, space: "
                     << (cfg.size) / (1024 * 1024)
                     << " MiB, I/O implementation: " << cfg.fileio_string();
        }
        catch (io_error&)
        {
            TLX_LOG1 << "foxxll: Error allocating disk '" << cfg.path << "', space: "
                     << (cfg.size) / (1024 * 1024)
                     << " MiB, I/O implementation: " << cfg.fileio_string();
            throw;
        }

        total_size += cfg.size;

        // create queue for the file.
        disk_queues::get_instance()->make_queue(disk_files_[i].get());

        block_allocators_[i] = new disk_block_allocator(disk_files_[i].get(), cfg);
    }

    if (ndisks_ > 1)
    {
        TLX_LOG1 << "foxxll: In total " << ndisks_ << " disks are allocated, space: "
                 << (total_size / (1024 * 1024)) << " MiB";
    }
}